

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdldl_interface.c
# Opt level: O3

c_int init_linsys_solver_qdldl
                (qdldl_solver **sp,csc *P,csc *A,c_float sigma,c_float *rho_vec,c_int polish)

{
  size_t __size;
  size_t __size_00;
  long lVar1;
  undefined1 auVar2 [16];
  csc *pcVar3;
  qdldl_solver *p;
  csc *pcVar4;
  c_float *pcVar5;
  QDLDL_float *pQVar6;
  c_int *pcVar7;
  QDLDL_int *pQVar8;
  QDLDL_bool *pQVar9;
  c_int *pcVar10;
  c_int *pcVar11;
  QDLDL_int QVar12;
  ulong uVar13;
  c_int Anz;
  c_int Pnz;
  long lVar14;
  c_int m;
  char *__format;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  csc *KKT_temp;
  csc *local_70;
  c_float local_68;
  qdldl_solver **local_60;
  csc *local_58;
  c_int local_50;
  size_t local_48;
  long local_40;
  c_float *local_38;
  
  local_68 = sigma;
  local_50 = polish;
  local_38 = rho_vec;
  p = (qdldl_solver *)calloc(1,0xe0);
  *sp = p;
  local_40 = P->n;
  p->n = local_40;
  lVar1 = A->m;
  p->m = lVar1;
  __size = lVar1 + local_40;
  p->sigma = local_68;
  p->polish = polish;
  p->solve = solve_linsys_qdldl;
  p->free = free_linsys_solver_qdldl;
  p->update_matrices = update_linsys_solver_matrices_qdldl;
  p->update_rho_vec = update_linsys_solver_rho_vec_qdldl;
  p->nthreads = 1;
  local_70 = A;
  local_60 = sp;
  local_58 = P;
  pcVar4 = (csc *)malloc(0x38);
  p->L = pcVar4;
  pcVar4->m = __size;
  pcVar4->n = __size;
  pcVar4->nz = -1;
  __size_00 = __size * 8;
  pcVar5 = (c_float *)malloc(__size_00);
  p->Dinv = pcVar5;
  pQVar6 = (QDLDL_float *)malloc(__size_00);
  p->D = pQVar6;
  pcVar7 = (c_int *)malloc(__size_00);
  p->P = pcVar7;
  pcVar5 = (c_float *)malloc(__size_00);
  p->bp = pcVar5;
  pcVar5 = (c_float *)malloc(__size_00);
  p->sol = pcVar5;
  local_48 = lVar1 * 8;
  pcVar5 = (c_float *)malloc(local_48);
  p->rho_inv_vec = pcVar5;
  pQVar8 = (QDLDL_int *)malloc(__size_00);
  p->etree = pQVar8;
  pQVar8 = (QDLDL_int *)malloc(__size_00);
  p->Lnz = pQVar8;
  pcVar7 = (c_int *)malloc(__size * 8 + 8);
  pcVar4->p = pcVar7;
  pQVar8 = (QDLDL_int *)malloc(__size * 0x18);
  pcVar4->i = (c_int *)0x0;
  pcVar4->x = (c_float *)0x0;
  p->iwork = pQVar8;
  pQVar9 = (QDLDL_bool *)malloc(__size);
  p->bwork = pQVar9;
  pQVar6 = (QDLDL_float *)malloc(__size_00);
  pcVar4 = local_58;
  p->fwork = pQVar6;
  auVar2 = _DAT_001b4120;
  if (local_50 == 0) {
    pcVar7 = (c_int *)malloc(local_58->p[local_40] << 3);
    p->PtoKKT = pcVar7;
    pcVar10 = (c_int *)malloc(local_70->p[local_70->n] << 3);
    p->AtoKKT = pcVar10;
    pcVar11 = (c_int *)malloc(local_48);
    pcVar3 = local_70;
    p->rhotoKKT = pcVar11;
    if (0 < lVar1) {
      lVar14 = 0;
      do {
        pcVar5[lVar14] = 1.0 / local_38[lVar14];
        lVar14 = lVar14 + 1;
      } while (lVar1 != lVar14);
    }
    KKT_temp = form_KKT(pcVar4,local_70,0,local_68,pcVar5,pcVar7,pcVar10,&p->Pdiag_idx,&p->Pdiag_n,
                        pcVar11);
    if (KKT_temp == (csc *)0x0) goto LAB_001ad198;
    Pnz = pcVar4->p[pcVar4->n];
    m = pcVar3->m;
    Anz = pcVar3->p[pcVar3->n];
    pcVar7 = p->PtoKKT;
    pcVar10 = p->AtoKKT;
    pcVar11 = p->rhotoKKT;
  }
  else {
    if (0 < lVar1) {
      lVar14 = lVar1 + -1;
      auVar17._8_4_ = (int)lVar14;
      auVar17._0_8_ = lVar14;
      auVar17._12_4_ = (int)((ulong)lVar14 >> 0x20);
      uVar13 = 0;
      auVar17 = auVar17 ^ _DAT_001b4120;
      auVar15 = _DAT_001b4110;
      do {
        auVar16 = auVar15 ^ auVar2;
        if ((bool)(~(auVar16._4_4_ == auVar17._4_4_ && auVar17._0_4_ < auVar16._0_4_ ||
                    auVar17._4_4_ < auVar16._4_4_) & 1)) {
          pcVar5[uVar13] = local_68;
        }
        if ((auVar16._12_4_ != auVar17._12_4_ || auVar16._8_4_ <= auVar17._8_4_) &&
            auVar16._12_4_ <= auVar17._12_4_) {
          pcVar5[uVar13 + 1] = local_68;
        }
        uVar13 = uVar13 + 2;
        lVar14 = auVar15._8_8_;
        auVar15._0_8_ = auVar15._0_8_ + 2;
        auVar15._8_8_ = lVar14 + 2;
      } while ((lVar1 + 1U & 0xfffffffffffffffe) != uVar13);
    }
    KKT_temp = form_KKT(local_58,local_70,0,local_68,pcVar5,(c_int *)0x0,(c_int *)0x0,(c_int **)0x0,
                        (c_int *)0x0,(c_int *)0x0);
    if (KKT_temp == (csc *)0x0) goto LAB_001ad198;
    pcVar10 = (c_int *)0x0;
    pcVar11 = (c_int *)0x0;
    Pnz = 0;
    Anz = 0;
    m = 0;
    pcVar7 = (c_int *)0x0;
  }
  permute_KKT(&KKT_temp,p,Pnz,Anz,m,pcVar7,pcVar10,pcVar11);
  pcVar3 = KKT_temp;
  if (KKT_temp != (csc *)0x0) {
    lVar1 = pcVar4->n;
    QVar12 = QDLDL_etree(KKT_temp->n,KKT_temp->p,KKT_temp->i,p->iwork,p->Lnz,p->etree);
    if (QVar12 < 0) {
      __format = 
      "Error in KKT matrix LDL factorization when computing the elimination tree. A is not perfectly upper triangular"
      ;
    }
    else {
      pQVar8 = (QDLDL_int *)malloc(QVar12 << 3);
      pcVar4 = p->L;
      pcVar4->i = pQVar8;
      pQVar6 = (QDLDL_float *)malloc(QVar12 << 3);
      pcVar4->x = pQVar6;
      QVar12 = QDLDL_factor(pcVar3->n,pcVar3->p,pcVar3->i,pcVar3->x,pcVar4->p,pQVar8,pQVar6,p->D,
                            p->Dinv,p->Lnz,p->etree,p->bwork,p->iwork,p->fwork);
      if (QVar12 < 0) {
        __format = 
        "Error in KKT matrix LDL factorization when computing the nonzero elements. There are zeros in the diagonal matrix"
        ;
      }
      else {
        if (lVar1 <= QVar12) {
          if (local_50 == 0) {
            p->KKT = pcVar3;
          }
          else {
            csc_spfree(pcVar3);
          }
          return 0;
        }
        __format = 
        "Error in KKT matrix LDL factorization when computing the nonzero elements. The problem seems to be non-convex"
        ;
      }
    }
    printf("ERROR in %s: ","LDL_factor");
    printf(__format);
    putchar(10);
    csc_spfree(pcVar3);
    free_linsys_solver_qdldl(p);
    *local_60 = (qdldl_solver *)0x0;
    return 5;
  }
LAB_001ad198:
  printf("ERROR in %s: ","init_linsys_solver_qdldl");
  printf("Error forming and permuting KKT matrix");
  putchar(10);
  free_linsys_solver_qdldl(p);
  *local_60 = (qdldl_solver *)0x0;
  return 4;
}

Assistant:

c_int init_linsys_solver_qdldl(qdldl_solver ** sp, const csc * P, const csc * A, c_float sigma, const c_float * rho_vec, c_int polish){

    // Define Variables
    csc * KKT_temp;     // Temporary KKT pointer
    c_int i;            // Loop counter
    c_int n_plus_m;     // Define n_plus_m dimension

    // Allocate private structure to store KKT factorization
    qdldl_solver *s;
    s = c_calloc(1, sizeof(qdldl_solver));
    *sp = s;

    // Size of KKT
    s->n = P->n;
    s->m = A->m;
    n_plus_m = s->n + s->m;

    // Sigma parameter
    s->sigma = sigma;

    // Polishing flag
    s->polish = polish;

    // Link Functions
    s->solve = &solve_linsys_qdldl;

#ifndef EMBEDDED
    s->free = &free_linsys_solver_qdldl;
#endif

#if EMBEDDED != 1
    s->update_matrices = &update_linsys_solver_matrices_qdldl;
    s->update_rho_vec = &update_linsys_solver_rho_vec_qdldl;
#endif

    // Assign type
    s->type = QDLDL_SOLVER;

    // Set number of threads to 1 (single threaded)
    s->nthreads = 1;

    // Sparse matrix L (lower triangular)
    // NB: We don not allocate L completely (CSC elements)
    //      L will be allocated during the factorization depending on the
    //      resulting number of elements.
    s->L = c_malloc(sizeof(csc));
    s->L->m = n_plus_m;
    s->L->n = n_plus_m;
    s->L->nz = -1;

    // Diagonal matrix stored as a vector D
    s->Dinv = (QDLDL_float *)c_malloc(sizeof(QDLDL_float) * n_plus_m);
    s->D    = (QDLDL_float *)c_malloc(sizeof(QDLDL_float) * n_plus_m);

    // Permutation vector P
    s->P    = (QDLDL_int *)c_malloc(sizeof(QDLDL_int) * n_plus_m);

    // Working vector
    s->bp   = (QDLDL_float *)c_malloc(sizeof(QDLDL_float) * n_plus_m);

    // Solution vector
    s->sol  = (QDLDL_float *)c_malloc(sizeof(QDLDL_float) * n_plus_m);

    // Parameter vector
    s->rho_inv_vec = (c_float *)c_malloc(sizeof(c_float) * s->m);

    // Elimination tree workspace
    s->etree = (QDLDL_int *)c_malloc(n_plus_m * sizeof(QDLDL_int));
    s->Lnz   = (QDLDL_int *)c_malloc(n_plus_m * sizeof(QDLDL_int));

    // Preallocate L matrix (Lx and Li are sparsity dependent)
    s->L->p = (c_int *)c_malloc((n_plus_m+1) * sizeof(QDLDL_int));

    // Lx and Li are sparsity dependent, so set them to
    // null initially so we don't try to free them prematurely
    s->L->i = OSQP_NULL;
    s->L->x = OSQP_NULL;

    // Preallocate workspace
    s->iwork = (QDLDL_int *)c_malloc(sizeof(QDLDL_int)*(3*n_plus_m));
    s->bwork = (QDLDL_bool *)c_malloc(sizeof(QDLDL_bool)*n_plus_m);
    s->fwork = (QDLDL_float *)c_malloc(sizeof(QDLDL_float)*n_plus_m);

    // Form and permute KKT matrix
    if (polish){ // Called from polish()
        // Use s->rho_inv_vec for storing param2 = vec(delta)
        for (i = 0; i < A->m; i++){
            s->rho_inv_vec[i] = sigma;
        }

        KKT_temp = form_KKT(P, A, 0, sigma, s->rho_inv_vec, OSQP_NULL, OSQP_NULL, OSQP_NULL, OSQP_NULL, OSQP_NULL);

        // Permute matrix
        if (KKT_temp)
            permute_KKT(&KKT_temp, s, OSQP_NULL, OSQP_NULL, OSQP_NULL, OSQP_NULL, OSQP_NULL, OSQP_NULL);
    }
    else { // Called from ADMM algorithm

        // Allocate vectors of indices
        s->PtoKKT = c_malloc((P->p[P->n]) * sizeof(c_int));
        s->AtoKKT = c_malloc((A->p[A->n]) * sizeof(c_int));
        s->rhotoKKT = c_malloc((A->m) * sizeof(c_int));

        // Use p->rho_inv_vec for storing param2 = rho_inv_vec
        for (i = 0; i < A->m; i++){
            s->rho_inv_vec[i] = 1. / rho_vec[i];
        }

        KKT_temp = form_KKT(P, A, 0, sigma, s->rho_inv_vec,
                            s->PtoKKT, s->AtoKKT,
                            &(s->Pdiag_idx), &(s->Pdiag_n), s->rhotoKKT);

        // Permute matrix
        if (KKT_temp)
            permute_KKT(&KKT_temp, s, P->p[P->n], A->p[A->n], A->m, s->PtoKKT, s->AtoKKT, s->rhotoKKT);
    }

    // Check if matrix has been created
    if (!KKT_temp){
#ifdef PRINTING
        c_eprint("Error forming and permuting KKT matrix");
#endif
        free_linsys_solver_qdldl(s);
        *sp = OSQP_NULL;
        return OSQP_LINSYS_SOLVER_INIT_ERROR;
    }

    // Factorize the KKT matrix
    if (LDL_factor(KKT_temp, s, P->n) < 0) {
        csc_spfree(KKT_temp);
        free_linsys_solver_qdldl(s);
        *sp = OSQP_NULL;
        return OSQP_NONCVX_ERROR;
    }

    if (polish){ // If KKT passed, assign it to KKT_temp
        // Polish, no need for KKT_temp
        csc_spfree(KKT_temp);
    }
    else { // If not embedded option 1 copy pointer to KKT_temp. Do not free it.
        s->KKT = KKT_temp;
    }


    // No error
    return 0;
}